

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O2

bool Rml::XMLParseTools::ReadAttribute(char **string,String *name,String *value)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  
  pbVar6 = (byte *)*string;
  ::std::__cxx11::string::assign((char *)name);
  ::std::__cxx11::string::assign((char *)value);
  while ((uVar3 = (ulong)*pbVar6, uVar3 < 0x21 && ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
  }
  bVar4 = false;
  while (1 < (byte)((char)uVar3 - 0x3dU)) {
    uVar5 = (int)uVar3 - 9;
    if (bVar4) {
      if ((0x17 < (byte)uVar5) || (bVar4 = true, (0x800013U >> (uVar5 & 0x1f) & 1) == 0)) {
        pbVar6 = pbVar6 + -1;
        goto LAB_002f148f;
      }
    }
    else if ((0x17 < (byte)uVar5) || (bVar4 = true, (0x800013U >> (uVar5 & 0x1f) & 1) == 0)) {
      ::std::__cxx11::string::push_back((char)name);
      bVar4 = false;
    }
    pbVar1 = pbVar6 + 1;
    pbVar6 = pbVar6 + 1;
    uVar3 = (ulong)*pbVar1;
  }
  if ((char)uVar3 == '>') {
    return false;
  }
  bVar2 = 0;
  uVar3 = 0x3d;
  while ((byte)uVar3 < 0x3f) {
    if ((0x2000000100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x8400000000U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0x3e) {
          return false;
        }
        break;
      }
      bVar2 = 1;
    }
    pbVar1 = pbVar6 + 1;
    pbVar6 = pbVar6 + 1;
    uVar3 = (ulong)*pbVar1;
  }
  do {
    if (((char)uVar3 == '\"') || ((int)uVar3 == 0x27)) {
LAB_002f14e1:
      pbVar6 = pbVar6 + bVar2;
LAB_002f148f:
      *string = (char *)pbVar6;
      return true;
    }
    if ((int)uVar3 == 0x3e) {
      return false;
    }
    if (!(bool)((char)uVar3 != ' ' | bVar2)) goto LAB_002f14e1;
    ::std::__cxx11::string::push_back((char)value);
    uVar3 = (ulong)pbVar6[1];
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

bool XMLParseTools::ReadAttribute(const char*& string, String& name, String& value)
{
	const char* ptr = string;

	name = "";
	value = "";

	// Skip whitespace
	while (StringUtilities::IsWhitespace(*ptr))
		ptr++;

	// Look for the end of the attribute name
	bool found_whitespace = false;
	while (*ptr != '=' && *ptr != '>' && (!found_whitespace || StringUtilities::IsWhitespace(*ptr)))
	{
		if (StringUtilities::IsWhitespace(*ptr))
			found_whitespace = true;
		else
			name += *ptr;
		ptr++;
	}
	if (*ptr == '>')
		return false;

	// If we stopped on an equals, parse the value
	if (*ptr == '=')
	{
		// Skip over white space, ='s and quotes
		bool quoted = false;
		while (StringUtilities::IsWhitespace(*ptr) || *ptr == '\'' || *ptr == '"' || *ptr == '=')
		{
			if (*ptr == '\'' || *ptr == '"')
				quoted = true;
			ptr++;
		}
		if (*ptr == '>')
			return false;

		// Store the value
		while (*ptr != '\'' && *ptr != '"' && *ptr != '>' && (*ptr != ' ' || quoted))
		{
			value += *ptr++;
		}
		if (*ptr == '>')
			return false;

		// Advance passed the quote
		if (quoted)
			ptr++;
	}
	else
	{
		ptr--;
	}

	// Update the string pointer
	string = ptr;

	return true;
}